

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyScoped<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  ScriptContext *requestContext;
  bool bVar2;
  PropertyId propertyId;
  FrameDisplay *this_01;
  InlineCache *inlineCache;
  void *aValue;
  RecyclableObject *object;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  this_01 = GetEnvForEvalCode(this);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  if (this_01->length == 1) {
    requestContext = *(ScriptContext **)(this + 0x78);
    aValue = FrameDisplay::GetItem(this_01,0);
    object = VarTo<Js::RecyclableObject>(aValue);
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),inlineCache,
               (uint)playout->inlineCacheIndex,true);
    bVar2 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      (object,false,object,propertyId,(Var *)&info.inlineCacheIndex,requestContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_90);
    if (bVar2) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
      SetReg<unsigned_char>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  OP_GetPropertyScoped_NoFastPath<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,playout);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            RecyclableObject *obj = VarTo<RecyclableObject>(pScope->GetItem(0));
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        OP_GetPropertyScoped_NoFastPath(playout);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }